

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearObjectStatePdu.cpp
# Opt level: O3

int __thiscall DIS::LinearObjectStatePdu::getMarshalledSize(LinearObjectStatePdu *this)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  pointer pLVar8;
  long lVar9;
  ulong uVar10;
  LinearSegmentParameter listElement;
  LinearSegmentParameter local_98;
  
  iVar2 = SyntheticEnvironmentFamilyPdu::getMarshalledSize
                    (&this->super_SyntheticEnvironmentFamilyPdu);
  iVar3 = EntityID::getMarshalledSize(&this->_objectID);
  iVar4 = EntityID::getMarshalledSize(&this->_referencedObjectID);
  iVar5 = SimulationAddress::getMarshalledSize(&this->_requesterID);
  iVar6 = SimulationAddress::getMarshalledSize(&this->_receivingID);
  iVar7 = ObjectType::getMarshalledSize(&this->_objectType);
  iVar2 = iVar7 + iVar5 + iVar4 + iVar3 + iVar2 + iVar6 + 4;
  pLVar8 = (this->_linearSegmentParameters).
           super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_linearSegmentParameters).
      super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>.
      _M_impl.super__Vector_impl_data._M_finish != pLVar8) {
    lVar9 = 0x58;
    uVar10 = 0;
    do {
      local_98._vptr_LinearSegmentParameter = (_func_int **)&PTR__LinearSegmentParameter_001a0658;
      local_98._segmentNumber = *(uchar *)((long)(&pLVar8->_segmentAppearance + -6) + lVar9);
      local_98._segmentAppearance._vptr_SixByteChunk = (_func_int **)&PTR__SixByteChunk_001a1300;
      local_98._segmentAppearance._otherParameters._4_2_ =
           *(undefined2 *)((pLVar8->_segmentAppearance)._otherParameters + lVar9 + -0x54);
      local_98._segmentAppearance._otherParameters._0_4_ =
           *(undefined4 *)((long)(&pLVar8->_segmentAppearance + -5) + lVar9);
      local_98._location._vptr_Vector3Double = (_func_int **)&PTR__Vector3Double_001a1778;
      local_98._location._z = *(double *)((long)(&pLVar8->_segmentAppearance + -3) + lVar9);
      pdVar1 = (double *)((long)(&pLVar8->_segmentAppearance + -4) + lVar9);
      local_98._location._x = *pdVar1;
      local_98._location._y = pdVar1[1];
      local_98._orientation._vptr_Orientation = (_func_int **)&PTR__Orientation_001a0a40;
      local_98._orientation._phi =
           *(float *)((pLVar8->_segmentAppearance)._otherParameters + lVar9 + -0x20);
      local_98._orientation._8_8_ =
           *(undefined8 *)((long)(&pLVar8->_segmentAppearance + -2) + lVar9);
      local_98._pad1 = *(uint *)((pLVar8->_segmentAppearance)._otherParameters + lVar9 + -0x10);
      local_98._88_8_ =
           *(undefined8 *)
            ((long)&((LinearSegmentParameter *)
                    (&((LinearSegmentParameter *)
                      (&((LinearSegmentParameter *)(&pLVar8->_segmentAppearance + -1))->
                        _segmentAppearance + -1))->_segmentAppearance + -1))->_segmentAppearance +
            lVar9 + 0xfffffffffffffff0U);
      iVar3 = LinearSegmentParameter::getMarshalledSize(&local_98);
      iVar2 = iVar2 + iVar3;
      LinearSegmentParameter::~LinearSegmentParameter(&local_98);
      uVar10 = uVar10 + 1;
      pLVar8 = (this->_linearSegmentParameters).
               super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar9 = lVar9 + 0x68;
    } while (uVar10 < (ulong)(((long)(this->_linearSegmentParameters).
                                     super__Vector_base<DIS::LinearSegmentParameter,_std::allocator<DIS::LinearSegmentParameter>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pLVar8 >> 3)
                             * 0x4ec4ec4ec4ec4ec5));
  }
  return iVar2;
}

Assistant:

int LinearObjectStatePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SyntheticEnvironmentFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + _objectID.getMarshalledSize();  // _objectID
   marshalSize = marshalSize + _referencedObjectID.getMarshalledSize();  // _referencedObjectID
   marshalSize = marshalSize + 2;  // _updateNumber
   marshalSize = marshalSize + 1;  // _forceID
   marshalSize = marshalSize + 1;  // _numberOfSegments
   marshalSize = marshalSize + _requesterID.getMarshalledSize();  // _requesterID
   marshalSize = marshalSize + _receivingID.getMarshalledSize();  // _receivingID
   marshalSize = marshalSize + _objectType.getMarshalledSize();  // _objectType

   for(unsigned long long idx=0; idx < _linearSegmentParameters.size(); idx++)
   {
        LinearSegmentParameter listElement = _linearSegmentParameters[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}